

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_util.h
# Opt level: O2

void webrtc::DownmixInterleavedToMonoImpl<short,int>
               (short *interleaved,size_t num_frames,int num_channels,short *deinterleaved)

{
  short *psVar1;
  short *psVar2;
  int iVar3;
  string *result;
  size_t local_198;
  FatalMessage local_190;
  
  local_198 = num_frames;
  result = rtc::CheckGTImpl_abi_cxx11_(num_channels,0,"num_channels > 0");
  if (result == (string *)0x0) {
    local_190.stream_ = (ostringstream)0x0;
    local_190._1_3_ = 0;
    result = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                       (&local_198,(uint *)&local_190,"num_frames > 0u");
    if (result == (string *)0x0) {
      psVar1 = interleaved + local_198 * (long)num_channels;
      while (interleaved < psVar1) {
        psVar2 = interleaved + num_channels;
        iVar3 = (int)*interleaved;
        while (interleaved = interleaved + 1, interleaved < psVar2) {
          iVar3 = iVar3 + *interleaved;
        }
        *deinterleaved = (short)(iVar3 / num_channels);
        deinterleaved = deinterleaved + 1;
      }
      return;
    }
    iVar3 = 0x9d;
  }
  else {
    iVar3 = 0x9c;
  }
  rtc::FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/include/audio_util.h"
             ,iVar3,result);
  rtc::FatalMessage::~FatalMessage(&local_190);
}

Assistant:

void DownmixInterleavedToMonoImpl(const T* interleaved,
                                  size_t num_frames,
                                  int num_channels,
                                  T* deinterleaved) {
  RTC_DCHECK_GT(num_channels, 0);
  RTC_DCHECK_GT(num_frames, 0u);

  const T* const end = interleaved + num_frames * num_channels;

  while (interleaved < end) {
    const T* const frame_end = interleaved + num_channels;

    Intermediate value = *interleaved++;
    while (interleaved < frame_end) {
      value += *interleaved++;
    }

    *deinterleaved++ = value / num_channels;
  }
}